

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

bool __thiscall
vkb::PhysicalDevice::enable_extension_if_present(PhysicalDevice *this,char *extension)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  pointer __lhs;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __lhs = (this->available_extensions).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  local_58 = (this->available_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)local_58 - (long)__lhs;
  for (lVar3 = lVar5 >> 7; pbVar4 = __lhs, 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = std::operator==(__lhs,extension);
    if (bVar2) goto LAB_0011c9d1;
    bVar2 = std::operator==(__lhs + 1,extension);
    pbVar4 = __lhs + 1;
    if (bVar2) goto LAB_0011c9d1;
    bVar2 = std::operator==(__lhs + 2,extension);
    pbVar4 = __lhs + 2;
    if (bVar2) goto LAB_0011c9d1;
    bVar2 = std::operator==(__lhs + 3,extension);
    pbVar4 = __lhs + 3;
    if (bVar2) goto LAB_0011c9d1;
    __lhs = __lhs + 4;
    lVar5 = lVar5 + -0x80;
  }
  lVar5 = lVar5 >> 5;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pbVar4 = local_58;
      if ((lVar5 != 3) || (bVar2 = std::operator==(__lhs,extension), pbVar4 = __lhs, bVar2))
      goto LAB_0011c9d1;
      pbVar4 = __lhs + 1;
    }
    bVar2 = std::operator==(pbVar4,extension);
    if (bVar2) goto LAB_0011c9d1;
    __lhs = pbVar4 + 1;
  }
  bVar2 = std::operator==(__lhs,extension);
  pbVar4 = local_58;
  if (bVar2) {
    pbVar4 = __lhs;
  }
LAB_0011c9d1:
  pbVar1 = (this->available_extensions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,extension,&local_59);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->extensions_to_enable,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return pbVar4 != pbVar1;
}

Assistant:

bool PhysicalDevice::enable_extension_if_present(const char* extension) {
    auto it = std::find_if(std::begin(available_extensions),
        std::end(available_extensions),
        [extension](std::string const& ext_name) { return ext_name == extension; });
    if (it != std::end(available_extensions)) {
        extensions_to_enable.push_back(extension);
        return true;
    }
    return false;
}